

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall HEkk::debugNonbasicFlagConsistent(HEkk *this)

{
  long lVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  long in_RDI;
  bool right_num_basic_variables;
  HighsInt var;
  HighsInt num_basic_variables;
  bool right_size;
  HighsInt numTot;
  SimplexBasis *basis;
  HighsLp *lp;
  HighsOptions *options;
  HighsDebugStatus return_status;
  int local_40;
  uint local_3c;
  HighsDebugStatus local_14;
  HighsDebugStatus local_4;
  
  if (*(int *)(*(long *)(in_RDI + 8) + 0x15c) < 1) {
    local_4 = kNotChecked;
  }
  else {
    local_14 = kOk;
    lVar1 = *(long *)(in_RDI + 8);
    iVar2 = *(int *)(in_RDI + 0x2198) + *(int *)(in_RDI + 0x219c);
    sVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990));
    if ((int)sVar3 != iVar2) {
      highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kError,"nonbasicFlag size error\n");
      local_14 = kLogicalError;
    }
    local_3c = 0;
    for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
      pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                          (long)local_40);
      if (*pvVar4 == '\0') {
        local_3c = local_3c + 1;
      }
    }
    if (local_3c != *(uint *)(in_RDI + 0x219c)) {
      highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kError,
                  "nonbasicFlag has %d, not %d basic variables\n",(ulong)local_3c,
                  (ulong)*(uint *)(in_RDI + 0x219c));
      local_14 = kLogicalError;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

HighsDebugStatus HEkk::debugNonbasicFlagConsistent() const {
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsOptions& options = *(this->options_);
  const HighsLp& lp = this->lp_;
  const SimplexBasis& basis = this->basis_;
  HighsInt numTot = lp.num_col_ + lp.num_row_;
  const bool right_size = (HighsInt)basis.nonbasicFlag_.size() == numTot;
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  HighsInt num_basic_variables = 0;
  for (HighsInt var = 0; var < numTot; var++) {
    if (basis.nonbasicFlag_[var] == kNonbasicFlagFalse) {
      num_basic_variables++;
    } else {
      assert(basis.nonbasicFlag_[var] == kNonbasicFlagTrue);
    }
  }
  bool right_num_basic_variables = num_basic_variables == lp.num_row_;
  if (!right_num_basic_variables) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag has %" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT
                " basic variables\n",
                num_basic_variables, lp.num_row_);
    assert(right_num_basic_variables);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}